

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfVecAttribute.cpp
# Opt level: O3

void __thiscall
Imf_2_5::TypedAttribute<Imath_2_5::Vec3<int>_>::readValueFrom
          (TypedAttribute<Imath_2_5::Vec3<int>_> *this,IStream *is,int size,int version)

{
  char b [4];
  char b_1 [4];
  char b_2 [4];
  int local_24;
  int local_20;
  int local_1c;
  
  (*is->_vptr_IStream[3])(is,&local_24,4);
  (this->_value).x = local_24;
  (*is->_vptr_IStream[3])(is,&local_20,4);
  (this->_value).y = local_20;
  (*is->_vptr_IStream[3])(is,&local_1c,4);
  (this->_value).z = local_1c;
  return;
}

Assistant:

void
V3iAttribute::readValueFrom (OPENEXR_IMF_INTERNAL_NAMESPACE::IStream &is, int size, int version)
{
    Xdr::read <StreamIO> (is, _value.x);
    Xdr::read <StreamIO> (is, _value.y);
    Xdr::read <StreamIO> (is, _value.z);
}